

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_seek_to_pcm_frame(ma_data_source *pDataSource,ma_uint64 frameIndex)

{
  ulong in_RSI;
  long *in_RDI;
  ma_data_source_base *pDataSourceBase;
  ma_result local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (*(long *)(*in_RDI + 8) == 0) {
    local_4 = MA_NOT_IMPLEMENTED;
  }
  else if ((ulong)in_RDI[2] < in_RSI) {
    local_4 = MA_INVALID_OPERATION;
  }
  else {
    local_4 = (**(code **)(*in_RDI + 8))(in_RDI,in_RDI[1] + in_RSI);
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_data_source_seek_to_pcm_frame(ma_data_source* pDataSource, ma_uint64 frameIndex)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDataSourceBase->vtable->onSeek == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    if (frameIndex > pDataSourceBase->rangeEndInFrames) {
        return MA_INVALID_OPERATION;    /* Trying to seek too far forward. */
    }

    MA_ASSERT(pDataSourceBase->vtable != NULL);

    return pDataSourceBase->vtable->onSeek(pDataSource, pDataSourceBase->rangeBegInFrames + frameIndex);
}